

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

Xt __thiscall cppforth::Forth::blWordFind(Forth *this,string *wordBuffer)

{
  char cVar1;
  __type_conflict _Var2;
  int iVar3;
  Cell CVar4;
  Cell CVar5;
  size_type sVar6;
  size_type sVar7;
  reference pcVar8;
  reference __lhs;
  iterator __first;
  difference_type dVar9;
  bool bVar10;
  Xt word;
  __normal_iterator<cppforth::Forth::localVariable_*,_std::vector<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>_>
  local_b0;
  iterator itEnd;
  iterator it;
  char *c;
  iterator __end3;
  iterator __begin3;
  string *__range3;
  string localName;
  allocator<char> local_49;
  string local_48;
  byte local_23;
  byte local_22;
  char local_21;
  Char currentChar_1;
  Char currentChar;
  string *psStack_20;
  char delim;
  string *wordBuffer_local;
  Forth *this_local;
  
  local_21 = ' ';
  psStack_20 = wordBuffer;
  wordBuffer_local = (string *)this;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
            (wordBuffer,0);
  iVar3 = getSourceBufferRemain(this);
  if (0 < iVar3) {
    CVar4 = getSourceAddress(this);
    CVar5 = getSourceBufferOffset(this);
    local_22 = getDataChar(this,CVar4 + CVar5);
    while( true ) {
      iVar3 = getSourceBufferRemain(this);
      bVar10 = false;
      if (((0 < iVar3) && (bVar10 = true, (uint)local_22 != (int)local_21)) &&
         (bVar10 = false, local_21 == ' ')) {
        iVar3 = isspace((uint)local_22);
        bVar10 = iVar3 != 0;
      }
      if (!bVar10) break;
      incSourceBufferOffset(this);
      CVar4 = getSourceAddress(this);
      CVar5 = getSourceBufferOffset(this);
      local_22 = getDataChar(this,CVar4 + CVar5);
    }
  }
  iVar3 = getSourceBufferRemain(this);
  if (0 < iVar3) {
    while (iVar3 = getSourceBufferRemain(this), 0 < iVar3) {
      CVar4 = getSourceAddress(this);
      CVar5 = getSourceBufferOffset(this);
      local_23 = getDataChar(this,CVar4 + CVar5);
      if (((uint)local_23 == (int)local_21) ||
         ((local_21 == ' ' && (iVar3 = isspace((uint)local_23), iVar3 != 0)))) break;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (psStack_20,local_23);
      incSourceBufferOffset(this);
    }
    iVar3 = getSourceBufferRemain(this);
    if (0 < iVar3) {
      incSourceBufferOffset(this);
    }
  }
  sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (psStack_20);
  if (sVar6 < 0x100) {
    sVar7 = std::
            vector<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>
            ::size(&this->localVariables);
    if (sVar7 != 0) {
      std::__cxx11::string::string((string *)&__range3,psStack_20);
      __end3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               begin((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range3)
      ;
      c = (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  end((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range3
                     );
      while (bVar10 = __gnu_cxx::
                      operator==<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                (&__end3,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&c), ((bVar10 ^ 0xffU) & 1) != 0) {
        pcVar8 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&__end3);
        cVar1 = toupper_ascii(*pcVar8);
        *pcVar8 = cVar1;
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end3);
      }
      itEnd = std::
              vector<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>
              ::begin(&this->localVariables);
      local_b0._M_current =
           (localVariable *)
           std::
           vector<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>::
           end(&this->localVariables);
      while (bVar10 = __gnu_cxx::
                      operator==<cppforth::Forth::localVariable_*,_std::vector<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>_>
                                (&itEnd,&local_b0), ((bVar10 ^ 0xffU) & 1) != 0) {
        __lhs = __gnu_cxx::
                __normal_iterator<cppforth::Forth::localVariable_*,_std::vector<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>_>
                ::operator*(&itEnd);
        _Var2 = std::operator==(&__lhs->localName,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&__range3);
        if (_Var2) {
          data(this,1);
          __first = std::
                    vector<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>
                    ::begin(&this->localVariables);
          dVar9 = std::
                  distance<__gnu_cxx::__normal_iterator<cppforth::Forth::localVariable*,std::vector<cppforth::Forth::localVariable,std::allocator<cppforth::Forth::localVariable>>>>
                            ((__normal_iterator<cppforth::Forth::localVariable_*,_std::vector<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>_>
                              )__first._M_current,
                             (__normal_iterator<cppforth::Forth::localVariable_*,_std::vector<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>_>
                              )itEnd._M_current);
          data(this,(Cell)dVar9);
          this_local._4_4_ = 0x1a;
          bVar10 = true;
          goto LAB_0015fa6f;
        }
        __gnu_cxx::
        __normal_iterator<cppforth::Forth::localVariable_*,_std::vector<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>_>
        ::operator++(&itEnd);
      }
      bVar10 = false;
LAB_0015fa6f:
      std::__cxx11::string::~string((string *)&__range3);
      if (bVar10) {
        return this_local._4_4_;
      }
    }
    this_local._4_4_ = findDefinition(this,psStack_20);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"WORD: very long word ",&local_49);
    throwMessage(this,&local_48,errorParsedStringOverflow);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

Xt blWordFind(std::string &wordBuffer) {

			auto delim = ' ';
			/****

			I need a buffer to store the result of the Forth `WORD` word.  As with the
			input buffer, I use a `std::string` so I don't need to worry about memory
			management.

			Note that while this is a `std::string`, its format is not a typical strings.
			The buffer returned by `WORD` has the word length as its first character.
			That is, it is a Forth _counted string_.

			****/
			wordBuffer.resize(0);  // First char of buffer is length.
			
			// Skip leading delimiters
			if (getSourceBufferRemain() > 0) {
				auto currentChar = getDataChar(getSourceAddress() + getSourceBufferOffset());
				while (getSourceBufferRemain() > 0 && ((currentChar == delim)
					|| (delim == ' ' && isspace(static_cast<unsigned char>(currentChar)))
					)) {
					incSourceBufferOffset();
					currentChar = getDataChar(getSourceAddress() + getSourceBufferOffset());
				}
			}
			if (getSourceBufferRemain() > 0) {
				// Copy characters until we see the delimiter again.
				while (getSourceBufferRemain() >0 ) {
					auto currentChar = getDataChar(getSourceAddress() + getSourceBufferOffset());	
					if( currentChar != delim
					&& !(delim == ' ' && (isspace(static_cast<unsigned char>(currentChar))))
					) {
					wordBuffer.push_back(static_cast<unsigned char>(currentChar));
					incSourceBufferOffset();
					} else {
						break;
					}
				}
				// source point to the delimiter char, skip it.
				if (getSourceBufferRemain() >0 ) {
					incSourceBufferOffset(); 
				}
			}
			if (wordBuffer.size() > 255){
				// @bug it is catched below
				throwMessage(std::string("WORD: very long word "), errorParsedStringOverflow);
				return 0;
			}
			if(localVariables.size()>0){
				std::string localName{wordBuffer};
				for(auto &c: localName) c=toupper_ascii(c);
				for(auto it=localVariables.begin(),itEnd=localVariables.end();it!=itEnd;++it){
					if((*it).localName==localName){
						// compale address of local variable
						// and retrun XT of FETCH @
						data(doLiteralXt);
						data(std::distance(localVariables.begin(),it));
						return pickReturnStackXt ;
					}
				}		
			}
			auto word = findDefinition(wordBuffer);
			return word;
			
		}